

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O3

JsValueRef
WScriptJsrt::DumpFunctionPositionCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  JsValueRef local_20;
  JsValueRef functionPosition;
  
  local_20 = (JsValueRef)0x0;
  if (1 < argumentCount) {
    JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtDiagGetFunctionPosition)(arguments[1],&local_20)
    ;
    if ((JVar1 != JsNoError) &&
       (JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)(&local_20),
       JVar1 != JsNoError)) {
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      PAL_fwprintf(pPVar2,
                   L"ERROR: ChakraRTInterface::JsGetUndefinedValue(&functionPosition) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar3);
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
      return (JsValueRef)0x0;
    }
    if (Debugger::debugger != (Debugger *)0x0) {
      Debugger::DumpFunctionPosition(Debugger::debugger,local_20);
    }
  }
  return (JsValueRef)0x0;
}

Assistant:

JsValueRef WScriptJsrt::DumpFunctionPositionCallback(JsValueRef callee, bool isConstructCall, JsValueRef * arguments, unsigned short argumentCount, void * callbackState)
{
    JsValueRef functionPosition = JS_INVALID_REFERENCE;

    if (argumentCount > 1)
    {
        if (ChakraRTInterface::JsDiagGetFunctionPosition(arguments[1], &functionPosition) != JsNoError)
        {
            // If we can't get the functionPosition pass undefined
            IfJsErrorFailLogAndRet(ChakraRTInterface::JsGetUndefinedValue(&functionPosition));
        }

        if (Debugger::debugger != nullptr)
        {
            Debugger::debugger->DumpFunctionPosition(functionPosition);
        }
    }

    return JS_INVALID_REFERENCE;
}